

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::ParameterValueAssignmentSyntax::ParameterValueAssignmentSyntax
          (ParameterValueAssignmentSyntax *this,Token hash,Token openParen,
          SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *parameters,Token closeParen)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  ParamAssignmentSyntax *pPVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  size_t index;
  
  uVar5 = openParen._0_8_;
  uVar6 = hash._0_8_;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).kind = ParameterValueAssignment;
  (this->hash).kind = (short)uVar6;
  (this->hash).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->hash).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->hash).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->hash).info = hash.info;
  (this->openParen).kind = (short)uVar5;
  (this->openParen).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openParen).info = openParen.info;
  SVar2 = (parameters->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(parameters->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->parameters).super_SyntaxListBase.super_SyntaxNode.parent =
       (parameters->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->parameters).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->parameters).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->parameters).super_SyntaxListBase.childCount = (parameters->super_SyntaxListBase).childCount
  ;
  (this->parameters).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0050b8f0;
  sVar1 = (parameters->elements).size_;
  (this->parameters).elements.data_ = (parameters->elements).data_;
  (this->parameters).elements.size_ = sVar1;
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  (this->closeParen).info = closeParen.info;
  (this->parameters).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  uVar7 = (this->parameters).elements.size_ + 1;
  if (1 < uVar7) {
    index = 0;
    do {
      pPVar4 = SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
                         (&this->parameters,index);
      (pPVar4->super_SyntaxNode).parent = &this->super_SyntaxNode;
      index = index + 1;
    } while (uVar7 >> 1 != index);
  }
  return;
}

Assistant:

struct SLANG_EXPORT NamedLabelSyntax : public SyntaxNode {
    Token name;
    Token colon;

    NamedLabelSyntax(Token name, Token colon) :
        SyntaxNode(SyntaxKind::NamedLabel), name(name), colon(colon) {
    }

    explicit NamedLabelSyntax(const NamedLabelSyntax&) = default;

    static bool isKind(SyntaxKind kind);

    TokenOrSyntax getChild(size_t index);
    ConstTokenOrSyntax getChild(size_t index) const;
    void setChild(size_t index, TokenOrSyntax child);

}